

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::ConcatStringBase::CopyImpl
          (ConcatStringBase *this,char16 *buffer,int itemCount,JavascriptString **items,
          StringCopyInfoStack *nestedStringTreeCopyInfos,byte recursionDepth)

{
  code *pcVar1;
  StringCopyInfo copyInfo;
  StringCopyInfoStack *this_00;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  uint uVar5;
  undefined4 *puVar6;
  char16 *dst;
  char16 *str;
  StringCopyInfo local_78;
  charcount_t local_60;
  int local_5c;
  CharCount copyCharLength;
  int newItemCount;
  JavascriptString **newItems;
  ScriptContext *pSStack_48;
  CharCount copyCharLength_1;
  JavascriptString *s;
  charcount_t local_38;
  int i;
  CharCount copiedCharLength;
  byte recursionDepth_local;
  StringCopyInfoStack *nestedStringTreeCopyInfos_local;
  JavascriptString **items_local;
  char16 *pcStack_18;
  int itemCount_local;
  char16 *buffer_local;
  ConcatStringBase *this_local;
  
  i._3_1_ = recursionDepth;
  _copiedCharLength = nestedStringTreeCopyInfos;
  nestedStringTreeCopyInfos_local = (StringCopyInfoStack *)items;
  items_local._4_4_ = itemCount;
  pcStack_18 = buffer;
  buffer_local = (char16 *)this;
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xe7,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (pcStack_18 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xe8,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_38 = 0;
  s._4_4_ = 0;
  do {
    cVar3 = local_38;
    if (items_local._4_4_ <= s._4_4_) {
      cVar4 = JavascriptString::GetLength((JavascriptString *)this);
      if (cVar3 != cVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                    ,0x11e,"(copiedCharLength == GetLength())",
                                    "copiedCharLength == GetLength()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      return;
    }
    pSStack_48 = (&nestedStringTreeCopyInfos_local->scriptContext)[s._4_4_];
    if (pSStack_48 != (ScriptContext *)0x0) {
      bVar2 = JavascriptString::IsFinalized((JavascriptString *)pSStack_48);
      if (bVar2) {
        newItems._4_4_ = JavascriptString::GetLength((JavascriptString *)pSStack_48);
        uVar5 = local_38 + newItems._4_4_;
        cVar3 = JavascriptString::GetLength((JavascriptString *)this);
        if (cVar3 < uVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,0xf7,
                                      "(copiedCharLength + copyCharLength <= this->GetLength())",
                                      "copiedCharLength + copyCharLength <= this->GetLength()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        dst = pcStack_18 + local_38;
        str = JavascriptString::GetString((JavascriptString *)pSStack_48);
        JavascriptString::CopyHelper(dst,str,newItems._4_4_);
        local_38 = newItems._4_4_ + local_38;
      }
      else if ((s._4_4_ == items_local._4_4_ + -1) &&
              (local_5c = (*(((RecyclableObject *)&pSStack_48->super_ScriptContextInfo)->
                            super_FinalizableObject).super_IRecyclerVisitedObject.
                            _vptr_IRecyclerVisitedObject[0x69])(pSStack_48,&copyCharLength),
              local_5c != -1)) {
        nestedStringTreeCopyInfos_local = _copyCharLength;
        s._4_4_ = -1;
        items_local._4_4_ = local_5c;
      }
      else {
        cVar3 = JavascriptString::GetLength((JavascriptString *)pSStack_48);
        local_60 = cVar3;
        cVar4 = JavascriptString::GetLength((JavascriptString *)this);
        if (cVar4 - local_38 < cVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                      ,0x10d,"(copyCharLength <= GetLength() - copiedCharLength)",
                                      "copyCharLength <= GetLength() - copiedCharLength");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if ((i._3_1_ == 3) &&
           (uVar5 = (*(((RecyclableObject *)&pSStack_48->super_ScriptContextInfo)->
                      super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x6a])(), this_00 = _copiedCharLength,
           (uVar5 & 1) != 0)) {
          StringCopyInfo::StringCopyInfo
                    (&local_78,(JavascriptString *)pSStack_48,pcStack_18 + local_38);
          copyInfo.destinationBuffer = local_78.destinationBuffer;
          copyInfo.sourceString = local_78.sourceString;
          copyInfo.isInitialized = local_78.isInitialized;
          copyInfo._17_7_ = local_78._17_7_;
          StringCopyInfoStack::Push(this_00,copyInfo);
        }
        else {
          if (3 < i._3_1_) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                        ,0x118,"(recursionDepth <= MaxCopyRecursionDepth)",
                                        "recursionDepth <= MaxCopyRecursionDepth");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          JavascriptString::Copy
                    ((JavascriptString *)pSStack_48,pcStack_18 + local_38,_copiedCharLength,
                     i._3_1_ + 1);
        }
        local_38 = local_60 + local_38;
      }
    }
    s._4_4_ = s._4_4_ + 1;
  } while( true );
}

Assistant:

void ConcatStringBase::CopyImpl(_Out_writes_(m_charLength) char16 *const buffer,
            int itemCount, _In_reads_(itemCount) JavascriptString * const * items,
            StringCopyInfoStack &nestedStringTreeCopyInfos, const byte recursionDepth)
    {

        Assert(!IsFinalized());
        Assert(buffer);

        CharCount copiedCharLength = 0;
        for(int i = 0; i < itemCount; ++i)
        {
            JavascriptString *const s = items[i];
            if(!s)
            {
                continue;
            }

            if (s->IsFinalized())
            {
                // If we have the buffer already, just copy it
                const CharCount copyCharLength = s->GetLength();
                AnalysisAssert(copiedCharLength + copyCharLength <= this->GetLength());
                CopyHelper(&buffer[copiedCharLength], s->GetString(), copyCharLength);
                copiedCharLength += copyCharLength;
                continue;
            }

            if(i == itemCount - 1)
            {
                JavascriptString * const * newItems;
                int newItemCount = s->GetRandomAccessItemsFromConcatString(newItems);
                if (newItemCount != -1)
                {
                    // Optimize for right-weighted ConcatString tree (the append case). Even though appending to a ConcatString will
                    // transition into a CompoundString fairly quickly, strings created by doing just a few appends are very common.
                    items = newItems;
                    itemCount = newItemCount;
                    i = -1;
                    continue;
                }
            }

            const CharCount copyCharLength = s->GetLength();
            AnalysisAssert(copyCharLength <= GetLength() - copiedCharLength);

            if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
            {
                // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                // the caller can deal with those after returning.
                nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[copiedCharLength]));
            }
            else
            {
                Assert(recursionDepth <= MaxCopyRecursionDepth);
                s->Copy(&buffer[copiedCharLength], nestedStringTreeCopyInfos, recursionDepth + 1);
            }
            copiedCharLength += copyCharLength;
        }

        Assert(copiedCharLength == GetLength());
    }